

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNNNCo.cpp
# Opt level: O1

void __thiscall NaPNNNController::set_nn_unit(NaPNNNController *this,NaNNUnit *pNN)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint n;
  NaPNSkip *this_00;
  
  NaPNNNUnit::set_nn_unit(&this->nnunit,pNN);
  uVar1 = (pNN->descr).nInputsRepeat;
  puVar3 = NaNeuralNetDescr::InputDelays(&pNN->descr);
  NaPNDelay::set_delay(&this->delay_e,uVar1,puVar3);
  uVar1 = (pNN->descr).nOutputsRepeat;
  puVar3 = NaNeuralNetDescr::OutputDelays(&pNN->descr);
  NaPNDelay::set_delay(&this->delay_r,uVar1,puVar3);
  uVar1 = NaPNDelay::get_max_delay(&this->delay_e);
  uVar2 = NaPNDelay::get_max_delay(&this->delay_r);
  n = uVar1 - uVar2;
  if (uVar1 < uVar2) {
    this_00 = &this->skip_e;
    n = uVar2 - uVar1;
  }
  else {
    this_00 = &this->skip_r;
  }
  NaPNSkip::set_skip_number(this_00,n);
  return;
}

Assistant:

void
NaPNNNController::set_nn_unit (NaNNUnit* pNN)
{
    nnunit.set_nn_unit(pNN);

    delay_e.set_delay(pNN->descr.nInputsRepeat, pNN->descr.InputDelays());
    delay_r.set_delay(pNN->descr.nOutputsRepeat, pNN->descr.OutputDelays());

    unsigned nLagE = delay_e.get_max_delay();
    unsigned nLagR = delay_r.get_max_delay();
    if(nLagE < nLagR)
	skip_e.set_skip_number(nLagR - nLagE);
    else
	skip_r.set_skip_number(nLagE - nLagR);
}